

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

void stringcache_destroy(StringCache *cache)

{
  MOJOSHADER_free UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  StringBucket *pSVar2;
  uint uVar3;
  StringBucket *pSVar4;
  ulong uVar5;
  
  if (cache != (StringCache *)0x0) {
    UNRECOVERED_JUMPTABLE = cache->f;
    pvVar1 = cache->d;
    uVar3 = cache->table_size;
    if (uVar3 != 0) {
      uVar5 = 0;
      do {
        pSVar4 = cache->hashtable[uVar5];
        cache->hashtable[uVar5] = (StringBucket *)0x0;
        if (pSVar4 != (StringBucket *)0x0) {
          do {
            pSVar2 = pSVar4->next;
            (*UNRECOVERED_JUMPTABLE)(pSVar4,pvVar1);
            pSVar4 = pSVar2;
          } while (pSVar2 != (StringBucket *)0x0);
          uVar3 = cache->table_size;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar3);
    }
    (*UNRECOVERED_JUMPTABLE)(cache->hashtable,pvVar1);
    (*UNRECOVERED_JUMPTABLE)(cache,pvVar1);
    return;
  }
  return;
}

Assistant:

void stringcache_destroy(StringCache *cache)
{
    if (cache == NULL)
        return;

    MOJOSHADER_free f = cache->f;
    void *d = cache->d;
    size_t i;

    for (i = 0; i < cache->table_size; i++)
    {
        StringBucket *bucket = cache->hashtable[i];
        cache->hashtable[i] = NULL;
        while (bucket)
        {
            StringBucket *next = bucket->next;
            f(bucket, d);
            bucket = next;
        } // while
    } // for

    f(cache->hashtable, d);
    f(cache, d);
}